

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

void prvTidyDropComments(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  
  if (node != (Node *)0x0) {
    do {
      pNVar1 = node->next;
      if (node->type == CommentTag) {
        prvTidyRemoveNode(node);
        prvTidyFreeNode(doc,node);
      }
      else if (node->content != (Node *)0x0) {
        prvTidyDropComments(doc,node->content);
      }
      node = pNVar1;
    } while (pNVar1 != (Node *)0x0);
  }
  return;
}

Assistant:

void TY_(DropComments)(TidyDocImpl* doc, Node* node)
{
    Node* next;

    while (node)
    {
        next = node->next;

        if (node->type == CommentTag)
        {
            TY_(RemoveNode)(node);
            TY_(FreeNode)(doc, node);
            node = next;
            continue;
        }

        if (node->content)
            TY_(DropComments)(doc, node->content);

        node = next;
    }
}